

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6cacf::DiskInterfaceTestMakeDirs::Run(DiskInterfaceTestMakeDirs *this)

{
  Test *pTVar1;
  bool condition;
  int iVar2;
  FILE *__stream;
  string path;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"path/with/double//slash/",(allocator<char> *)&local_40);
  pTVar1 = g_current_test;
  condition = DiskInterface::MakeDirs
                        (&(this->super_DiskInterfaceTest).disk_.super_DiskInterface,&local_60);
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0xc3,"disk_.MakeDirs(path)");
  std::operator+(&local_40,&local_60,"a_file");
  __stream = fopen(local_40._M_dataplus._M_p,"w");
  std::__cxx11::string::~string((string *)&local_40);
  testing::Test::Check
            (g_current_test,__stream != (FILE *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0xc5,"f");
  pTVar1 = g_current_test;
  iVar2 = fclose(__stream);
  testing::Test::Check
            (pTVar1,iVar2 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/disk_interface_test.cc"
             ,0xc6,"0 == fclose(f)");
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, MakeDirs) {
  string path = "path/with/double//slash/";
  EXPECT_TRUE(disk_.MakeDirs(path));
  FILE* f = fopen((path + "a_file").c_str(), "w");
  EXPECT_TRUE(f);
  EXPECT_EQ(0, fclose(f));
#ifdef _WIN32
  string path2 = "another\\with\\back\\\\slashes\\";
  EXPECT_TRUE(disk_.MakeDirs(path2.c_str()));
  FILE* f2 = fopen((path2 + "a_file").c_str(), "w");
  EXPECT_TRUE(f2);
  EXPECT_EQ(0, fclose(f2));
#endif
}